

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope.cxx
# Opt level: O2

void __thiscall xray_re::xr_envelope::load_1(xr_envelope *this,xr_reader *r)

{
  uint8_t *puVar1;
  uint *puVar2;
  undefined1 in_stack_00000008 [16];
  
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + 4;
  this->m_behaviour0 = *puVar1;
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + 4;
  this->m_behaviour1 = *puVar1;
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  xr_reader::
  r_seq<std::vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>>,xray_re::xr_reader::f_r_new<xray_re::xr_key>>
            (r,(ulong)*puVar2,&this->m_keys,(f_r_new<xray_re::xr_key>)in_stack_00000008);
  return;
}

Assistant:

void xr_envelope::load_1(xr_reader& r)
{
	m_behaviour0 = uint8_t(r.r_u32() & UINT8_MAX);
	m_behaviour1 = uint8_t(r.r_u32() & UINT8_MAX);
	r.r_seq(r.r_u32(), m_keys, xr_reader::f_r_new<xr_key>(&xr_key::load_1));
}